

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int push_change_cipher_spec(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  if ((tls->field_0x160 & 4) == 0) {
    return 0;
  }
  iVar4 = ptls_buffer_reserve(sendbuf,3);
  if (iVar4 == 0) {
    puVar2 = sendbuf->base;
    sVar7 = sendbuf->off;
    puVar1 = puVar2 + sVar7;
    puVar1[0] = '\x14';
    puVar1[1] = '\x03';
    puVar2[sVar7 + 2] = '\x03';
    sendbuf->off = sendbuf->off + 3;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve(sendbuf,2);
  if (iVar4 == 0) {
    puVar1 = sendbuf->base;
    sVar7 = sendbuf->off;
    (puVar1 + sVar7)[0] = '\0';
    (puVar1 + sVar7)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar4 = 0;
  }
  if (iVar4 == 0) {
    sVar7 = sendbuf->off;
    iVar4 = ptls_buffer_reserve(sendbuf,1);
    if (iVar4 == 0) {
      sendbuf->base[sendbuf->off] = '\x01';
      sendbuf->off = sendbuf->off + 1;
      iVar4 = 0;
    }
    if (iVar4 == 0) {
      uVar6 = sendbuf->off - sVar7;
      lVar5 = 8;
      do {
        sendbuf->base[sVar7 - 2] = (uint8_t)(uVar6 >> ((byte)lVar5 & 0x3f));
        lVar5 = lVar5 + -8;
        sVar7 = sVar7 + 1;
      } while (lVar5 != -8);
      bVar3 = true;
      goto LAB_00114e6b;
    }
  }
  bVar3 = false;
LAB_00114e6b:
  if (bVar3) {
    tls->field_0x160 = tls->field_0x160 & 0xfb;
  }
  return iVar4;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret = 0;

    if (!tls->send_change_cipher_spec)
        goto Exit;
    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(sendbuf, 1); });
    tls->send_change_cipher_spec = 0;
Exit:
    return ret;
}